

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLtree.c
# Opt level: O0

int htmlNodeDump(xmlBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur)

{
  xmlBufPtr buf_00;
  size_t sVar1;
  size_t ret;
  xmlBufPtr buffer;
  xmlNodePtr cur_local;
  xmlDocPtr doc_local;
  xmlBufferPtr buf_local;
  
  if ((buf == (xmlBufferPtr)0x0) || (cur == (xmlNodePtr)0x0)) {
    buf_local._4_4_ = -1;
  }
  else {
    xmlInitParser();
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 == (xmlBufPtr)0x0) {
      buf_local._4_4_ = -1;
    }
    else {
      sVar1 = htmlBufNodeDumpFormat(buf_00,doc,cur,1);
      xmlBufBackToBuffer(buf_00);
      if (sVar1 < 0x80000000) {
        buf_local._4_4_ = (int)sVar1;
      }
      else {
        buf_local._4_4_ = -1;
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
htmlNodeDump(xmlBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur) {
    xmlBufPtr buffer;
    size_t ret;

    if ((buf == NULL) || (cur == NULL))
        return(-1);

    xmlInitParser();
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return(-1);

    ret = htmlBufNodeDumpFormat(buffer, doc, cur, 1);

    xmlBufBackToBuffer(buffer);

    if (ret > INT_MAX)
        return(-1);
    return((int) ret);
}